

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

char * uv__strdup(char *s)

{
  size_t sVar1;
  void *__dest;
  char *pcVar2;
  
  sVar1 = strlen(s);
  sVar1 = sVar1 + 1;
  if (sVar1 == 0) {
    __dest = (void *)0x0;
  }
  else {
    __dest = (void *)(*(code *)uv__allocator_0)(sVar1);
  }
  if (__dest != (void *)0x0) {
    pcVar2 = (char *)memcpy(__dest,s,sVar1);
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

char* uv__strdup(const char* s) {
  size_t len = strlen(s) + 1;
  char* m = uv__malloc(len);
  if (m == NULL)
    return NULL;
  return memcpy(m, s, len);
}